

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void updateAccumulator(Parse *pParse,int regAcc,AggInfo *pAggInfo)

{
  byte bVar1;
  Vdbe *p;
  ExprList *pList;
  FuncDef *p_00;
  bool bVar2;
  int iVar3;
  CollSeq *zP4;
  int *piVar4;
  Op *pOVar5;
  int iVar6;
  int iVar7;
  AggInfo_func *pAVar8;
  ExprList_item *pEVar9;
  Expr **ppEVar10;
  bool bVar11;
  int local_68;
  int local_64;
  int local_60;
  
  p = pParse->pVdbe;
  pAggInfo->directMode = '\x01';
  if (pAggInfo->nFunc < 1) {
    local_68 = 0;
  }
  else {
    pAVar8 = pAggInfo->aFunc;
    iVar6 = 0;
    local_68 = 0;
    do {
      pList = (pAVar8->pExpr->x).pList;
      iVar7 = 0;
      local_64 = 0;
      if (pList != (ExprList *)0x0) {
        iVar7 = pList->nExpr;
        local_64 = sqlite3GetTempRange(pParse,iVar7);
        sqlite3ExprCodeExprList(pParse,pList,local_64,0,'\x01');
      }
      iVar3 = pAVar8->iDistinct;
      if (iVar3 < 0) {
        local_60 = 0;
      }
      else {
        local_60 = pParse->nLabel + -1;
        pParse->nLabel = local_60;
        codeDistinct(pParse,iVar3,local_60,1,local_64);
      }
      if ((pAVar8->pFunc->funcFlags & 0x20) != 0) {
        if (iVar7 < 1) {
          bVar11 = true;
          zP4 = (CollSeq *)0x0;
        }
        else {
          pEVar9 = pList->a;
          iVar3 = 1;
          do {
            zP4 = sqlite3ExprCollSeq(pParse,pEVar9->pExpr);
            bVar11 = zP4 == (CollSeq *)0x0;
            if (!bVar11) break;
            pEVar9 = pEVar9 + 1;
            bVar2 = iVar3 < iVar7;
            iVar3 = iVar3 + 1;
          } while (bVar2);
        }
        if (bVar11) {
          zP4 = pParse->db->pDfltColl;
        }
        if (local_68 == 0) {
          if (pAggInfo->nAccumulator == 0) {
            local_68 = 0;
          }
          else {
            local_68 = pParse->nMem + 1;
            pParse->nMem = local_68;
          }
        }
        iVar3 = sqlite3VdbeAddOp3(p,0x52,local_68,0,0);
        sqlite3VdbeChangeP4(p,iVar3,(char *)zP4,-2);
      }
      sqlite3VdbeAddOp3(p,0x9a,0,local_64,pAVar8->iMem);
      p_00 = pAVar8->pFunc;
      if (p->db->mallocFailed == '\0') {
        pOVar5 = p->aOp;
        iVar3 = p->nOp;
        pOVar5[(long)iVar3 + -1].p4type = -8;
        pOVar5[(long)iVar3 + -1].p4.pKeyInfo = (KeyInfo *)p_00;
      }
      else if ((p_00->funcFlags & 0x10) != 0) {
        sqlite3DbFreeNN(p->db,p_00);
      }
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = (ushort)iVar7 & 0xff;
      }
      if (iVar7 == 1) {
        if (local_64 != 0) {
          bVar1 = pParse->nTempReg;
          if ((ulong)bVar1 < 8) {
            pParse->nTempReg = bVar1 + 1;
            piVar4 = pParse->aTempReg + bVar1;
            goto LAB_001a6584;
          }
        }
      }
      else if (pParse->nRangeReg < iVar7) {
        pParse->nRangeReg = iVar7;
        piVar4 = &pParse->iRangeReg;
LAB_001a6584:
        *piVar4 = local_64;
      }
      if (local_60 != 0) {
        sqlite3VdbeResolveLabel(p,local_60);
      }
      iVar6 = iVar6 + 1;
      pAVar8 = pAVar8 + 1;
    } while (iVar6 < pAggInfo->nFunc);
  }
  if ((local_68 == 0) && (local_68 = regAcc, pAggInfo->nAccumulator == 0)) {
    local_68 = 0;
  }
  if (local_68 == 0) {
    iVar6 = 0;
  }
  else {
    iVar6 = sqlite3VdbeAddOp3(p,0x12,local_68,0,0);
  }
  if (0 < pAggInfo->nAccumulator) {
    ppEVar10 = &pAggInfo->aCol->pExpr;
    iVar7 = 0;
    do {
      sqlite3ExprCode(pParse,*ppEVar10,*(int *)((long)ppEVar10 + -4));
      iVar7 = iVar7 + 1;
      ppEVar10 = ppEVar10 + 4;
    } while (iVar7 < pAggInfo->nAccumulator);
  }
  pAggInfo->directMode = '\0';
  if (iVar6 != 0) {
    if (p->db->mallocFailed == '\0') {
      iVar7 = p->nOp + -1;
      if (-1 < iVar6) {
        iVar7 = iVar6;
      }
      pOVar5 = p->aOp + iVar7;
    }
    else {
      pOVar5 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar5->p2 = p->nOp;
  }
  return;
}

Assistant:

static void updateAccumulator(Parse *pParse, int regAcc, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  int regHit = 0;
  int addrHitTest = 0;
  struct AggInfo_func *pF;
  struct AggInfo_col *pC;

  pAggInfo->directMode = 1;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    int nArg;
    int addrNext = 0;
    int regAgg;
    ExprList *pList = pF->pExpr->x.pList;
    assert( !ExprHasProperty(pF->pExpr, EP_xIsSelect) );
    if( pList ){
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);
      sqlite3ExprCodeExprList(pParse, pList, regAgg, 0, SQLITE_ECEL_DUP);
    }else{
      nArg = 0;
      regAgg = 0;
    }
    if( pF->iDistinct>=0 ){
      addrNext = sqlite3VdbeMakeLabel(pParse);
      testcase( nArg==0 );  /* Error condition */
      testcase( nArg>1 );   /* Also an error */
      codeDistinct(pParse, pF->iDistinct, addrNext, 1, regAgg);
    }
    if( pF->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
      CollSeq *pColl = 0;
      struct ExprList_item *pItem;
      int j;
      assert( pList!=0 );  /* pList!=0 if pF->pFunc has NEEDCOLL */
      for(j=0, pItem=pList->a; !pColl && j<nArg; j++, pItem++){
        pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
      }
      if( !pColl ){
        pColl = pParse->db->pDfltColl;
      }
      if( regHit==0 && pAggInfo->nAccumulator ) regHit = ++pParse->nMem;
      sqlite3VdbeAddOp4(v, OP_CollSeq, regHit, 0, 0, (char *)pColl, P4_COLLSEQ);
    }
    sqlite3VdbeAddOp3(v, OP_AggStep, 0, regAgg, pF->iMem);
    sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, (u8)nArg);
    sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    if( addrNext ){
      sqlite3VdbeResolveLabel(v, addrNext);
    }
  }
  if( regHit==0 && pAggInfo->nAccumulator ){
    regHit = regAcc;
  }
  if( regHit ){
    addrHitTest = sqlite3VdbeAddOp1(v, OP_If, regHit); VdbeCoverage(v);
  }
  for(i=0, pC=pAggInfo->aCol; i<pAggInfo->nAccumulator; i++, pC++){
    sqlite3ExprCode(pParse, pC->pExpr, pC->iMem);
  }
  pAggInfo->directMode = 0;
  if( addrHitTest ){
    sqlite3VdbeJumpHere(v, addrHitTest);
  }
}